

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O0

void create_artifact_set(artifact_set_data *data)

{
  bool bVar1;
  void *p;
  _Bool not_done;
  int *tval_total;
  wchar_t aidx;
  wchar_t i;
  artifact_set_data *data_local;
  
  tval_total._0_4_ = 1;
  _aidx = data;
  p = mem_zalloc(0x90);
  bVar1 = true;
  for (tval_total._4_4_ = L'\0'; tval_total._4_4_ < L'$';
      tval_total._4_4_ = tval_total._4_4_ + L'\x01') {
    *(int *)((long)p + (long)tval_total._4_4_ * 4) = ((_aidx->tv_num[tval_total._4_4_] + 1) * 4) / 5
    ;
  }
  while (bVar1) {
    bVar1 = false;
    for (tval_total._4_4_ = L'\0'; tval_total._4_4_ < L'$';
        tval_total._4_4_ = tval_total._4_4_ + L'\x01') {
      if (0 < *(int *)((long)p + (long)tval_total._4_4_ * 4)) {
        design_artifact(_aidx,tval_total._4_4_,(int *)&tval_total);
        *(int *)((long)p + (long)tval_total._4_4_ * 4) =
             *(int *)((long)p + (long)tval_total._4_4_ * 4) + -1;
        tval_total._0_4_ = (int)tval_total + 1;
        bVar1 = true;
      }
    }
  }
  for (; (int)tval_total < (int)(z_info->a_max - 1); tval_total._0_4_ = (int)tval_total + 1) {
    design_artifact(_aidx,L'\0',(int *)&tval_total);
  }
  mem_free(p);
  return;
}

Assistant:

static void create_artifact_set(struct artifact_set_data *data)
{
	int i, aidx = 1;
	int *tval_total = mem_zalloc(TV_MAX * sizeof(int));
	bool not_done = true;

	/* Get min tval frequencies for the new artifacts */
	for (i = 0; i < TV_MAX; i++) {
		/* At least 80% as many for each tval */
		tval_total[i] = (4 * (data->tv_num[i] + 1)) / 5;
	}

	/* Allocate a minimal set of artifacts to the tvals */
	while (not_done) {
		not_done = false;

		/* Multiple passes through tvals until all have enough artifacts */ 
		for (i = 0; i < TV_MAX; i++) {
			if (tval_total[i] > 0) {
				design_artifact(data, i, &aidx);
				tval_total[i]--;
				aidx++;
				not_done = true;
			}
		}
	}

	/* Allocate remaining artifacts at random */
	while (aidx < z_info->a_max - 1) {
		design_artifact(data, TV_NULL, &aidx);
		aidx++;
	}

	mem_free(tval_total);
}